

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali_variant.c
# Opt level: O2

size_t cali_variant_pack(cali_variant_t v,uchar *buf)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = vlenc_u64(v.type_and_size,buf);
  sVar2 = vlenc_u64(v.value.v_uint,buf + sVar1);
  return sVar2 + sVar1;
}

Assistant:

size_t cali_variant_pack(cali_variant_t v, unsigned char* buf)
{
    size_t pos = 0;

    pos += vlenc_u64(v.type_and_size, buf);
    pos += vlenc_u64(v.value.v_uint, buf + pos);

    return pos;
}